

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O1

fio_str_info_s *
fiobj_data_pread(fio_str_info_s *__return_storage_ptr__,FIOBJ io,intptr_t start_at,uintptr_t length)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  uintptr_t uVar7;
  long lVar8;
  long __offset;
  size_t __nbytes;
  stat stat;
  stat local_c0;
  
  for (; (((io != 0 && ((io & 1) == 0)) && (((uint)io & 6) != 6)) &&
         (*(char *)(io & 0xfffffffffffffff8) == '+')); io = *(ulong *)(io + 0x10)) {
    piVar3 = __errno_location();
    *piVar3 = 0;
    if (*(int *)(io + 0x30) != -2) {
      if (*(int *)(io + 0x30) != -1) {
        goto LAB_00140d99;
      }
      if (start_at < 0) {
        start_at = start_at + *(long *)(io + 0x20);
      }
      uVar4 = 0;
      if (0 < start_at) {
        uVar4 = start_at;
      }
      uVar1 = *(ulong *)(io + 0x20);
      if (uVar1 <= uVar4) {
        uVar4 = uVar1;
      }
      uVar7 = uVar1 - uVar4;
      if (uVar4 + length <= uVar1) {
        uVar7 = length;
      }
      if (uVar7 == 0) goto LAB_00140d25;
      __return_storage_ptr__->capa = 0;
      __return_storage_ptr__->len = uVar7;
      pcVar5 = (char *)(uVar4 + *(long *)(io + 8));
      goto LAB_00140e32;
    }
    if (start_at < 0) {
      start_at = start_at + *(long *)(io + 0x20);
    }
    if (start_at < 1) {
      start_at = 0;
    }
    uVar4 = *(ulong *)(io + 0x20);
    if (uVar4 <= (ulong)start_at) {
      start_at = uVar4;
    }
    if (uVar4 < start_at + length) {
      length = uVar4 - start_at;
    }
    if (length == 0) goto LAB_00140d25;
  }
  piVar3 = __errno_location();
  *piVar3 = 0xe;
  goto LAB_00140d25;
  while (*piVar3 == 4) {
LAB_00140d99:
    iVar2 = fstat(*(int *)(io + 0x30),&local_c0);
    if (iVar2 == 0) goto LAB_00140dbe;
  }
  local_c0.st_size = 0xffffffffffffffff;
LAB_00140dbe:
  lVar8 = (start_at >> 0x3f & local_c0.st_size) + start_at;
  __offset = 0;
  if (0 < lVar8) {
    __offset = lVar8;
  }
  __nbytes = local_c0.st_size - __offset;
  if (__offset + length <= (ulong)local_c0.st_size) {
    __nbytes = length;
  }
  if (__nbytes == 0) {
    *(undefined8 *)(io + 0x18) = 0;
    fio_free(*(void **)(io + 8));
    *(undefined8 *)(io + 8) = 0;
    __return_storage_ptr__->data = (char *)0x0;
    __return_storage_ptr__->capa = 0;
    __return_storage_ptr__->len = 0;
    return __return_storage_ptr__;
  }
  *(undefined8 *)(io + 0x20) = 0;
  *(undefined8 *)(io + 0x28) = 0;
  fiobj_data_pre_write(io,__nbytes + 1);
  sVar6 = pread(*(int *)(io + 0x30),*(void **)(io + 8),__nbytes,__offset);
  if (0 < (long)sVar6) {
    *(undefined1 *)(*(long *)(io + 8) + sVar6) = 0;
    __return_storage_ptr__->capa = 0;
    __return_storage_ptr__->len = sVar6;
    pcVar5 = *(char **)(io + 8);
LAB_00140e32:
    __return_storage_ptr__->data = pcVar5;
    return __return_storage_ptr__;
  }
LAB_00140d25:
  __return_storage_ptr__->capa = 0;
  __return_storage_ptr__->len = 0;
  __return_storage_ptr__->data = (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

fio_str_info_s fiobj_data_pread(FIOBJ io, intptr_t start_at, uintptr_t length) {
  if (!io || !FIOBJ_TYPE_IS(io, FIOBJ_T_DATA)) {
    errno = EFAULT;
    return (fio_str_info_s){
        .data = NULL,
        .len = 0,
    };
  }

  errno = 0;
  switch (obj2io(io)->fd) {
  case -1:
    return fiobj_data_pread_str(io, start_at, length);
    break;
  case -2:
    return fiobj_data_pread_slice(io, start_at, length);
    break;
  default:
    return fiobj_data_pread_file(io, start_at, length);
  }
}